

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O3

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  pointer *ppWVar1;
  iterator iVar2;
  DictUnit *pDVar3;
  const_iterator pRVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  WordRange *__args;
  WordRange wr;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> mixRes;
  WordRange local_58;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_48;
  
  local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (WordRange *)0x0;
  local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (WordRange *)0x0;
  local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MixSegment::Cut(&this->mixSeg_,begin,end,&local_48,hmm);
  __args = local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    do {
      pRVar4 = __args->left;
      lVar5 = ((long)__args->right - (long)pRVar4 >> 2) * -0x3333333333333333;
      if (2 < lVar5 + 1U) {
        uVar6 = 1;
        lVar7 = 0x28;
        do {
          local_58.left = (const_iterator)((long)&pRVar4[-2].rune + lVar7);
          local_58.right = (const_iterator)((long)&pRVar4[-1].rune + lVar7);
          pDVar3 = Trie::Find(this->trie_->trie_,local_58.left,
                              (const_iterator)((long)&pRVar4->rune + lVar7));
          if (pDVar3 != (DictUnit *)0x0) {
            iVar2._M_current =
                 (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
              _M_realloc_insert<cppjieba::WordRange_const&>
                        ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                         iVar2,&local_58);
            }
            else {
              (iVar2._M_current)->left = local_58.left;
              (iVar2._M_current)->right = local_58.right;
              ppWVar1 = &(res->
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppWVar1 = *ppWVar1 + 1;
            }
          }
          uVar6 = uVar6 + 1;
          pRVar4 = __args->left;
          lVar5 = ((long)__args->right - (long)pRVar4 >> 2) * -0x3333333333333333;
          lVar7 = lVar7 + 0x14;
        } while (uVar6 < lVar5 + 1U);
      }
      if (3 < lVar5 + 1U) {
        uVar6 = 2;
        lVar5 = 0x3c;
        do {
          local_58.left = (const_iterator)((long)&pRVar4[-3].rune + lVar5);
          local_58.right = (const_iterator)((long)&pRVar4[-1].rune + lVar5);
          pDVar3 = Trie::Find(this->trie_->trie_,local_58.left,
                              (const_iterator)((long)&pRVar4->rune + lVar5));
          if (pDVar3 != (DictUnit *)0x0) {
            iVar2._M_current =
                 (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
              _M_realloc_insert<cppjieba::WordRange_const&>
                        ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                         iVar2,&local_58);
            }
            else {
              (iVar2._M_current)->left = local_58.left;
              (iVar2._M_current)->right = local_58.right;
              ppWVar1 = &(res->
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppWVar1 = *ppWVar1 + 1;
            }
          }
          pRVar4 = __args->left;
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x14;
        } while (uVar6 < ((long)__args->right - (long)pRVar4 >> 2) * -0x3333333333333333 + 1U);
      }
      iVar2._M_current =
           (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
        _M_realloc_insert<cppjieba::WordRange_const&>
                  ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,iVar2,
                   __args);
      }
      else {
        pRVar4 = __args->right;
        (iVar2._M_current)->left = __args->left;
        (iVar2._M_current)->right = pRVar4;
        ppWVar1 = &(res->
                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppWVar1 = *ppWVar1 + 1;
      }
      __args = __args + 1;
    } while (__args != local_48.
                       super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_start != (WordRange *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    //use mix Cut first
    vector<WordRange> mixRes;
    mixSeg_.Cut(begin, end, mixRes, hmm);

    vector<WordRange> fullRes;
    for (vector<WordRange>::const_iterator mixResItr = mixRes.begin(); mixResItr != mixRes.end(); mixResItr++) {
      if (mixResItr->Length() > 2) {
        for (size_t i = 0; i + 1 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 1);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      if (mixResItr->Length() > 3) {
        for (size_t i = 0; i + 2 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 2);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      res.push_back(*mixResItr);
    }
  }